

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metrics.cc
# Opt level: O1

Metric * __thiscall Metrics::NewMetric(Metrics *this,string *name)

{
  pointer *pppMVar1;
  iterator __position;
  Metric *metric;
  Metric *local_20;
  
  local_20 = (Metric *)operator_new(0x30);
  (local_20->name)._M_dataplus._M_p = (pointer)&(local_20->name).field_2;
  (local_20->name)._M_string_length = 0;
  (local_20->name).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_assign((string *)local_20);
  local_20->count = 0;
  local_20->sum = 0;
  __position._M_current =
       (this->metrics_).super__Vector_base<Metric_*,_std::allocator<Metric_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->metrics_).super__Vector_base<Metric_*,_std::allocator<Metric_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<Metric*,std::allocator<Metric*>>::_M_realloc_insert<Metric*const&>
              ((vector<Metric*,std::allocator<Metric*>> *)this,__position,&local_20);
  }
  else {
    *__position._M_current = local_20;
    pppMVar1 = &(this->metrics_).super__Vector_base<Metric_*,_std::allocator<Metric_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    *pppMVar1 = *pppMVar1 + 1;
  }
  return local_20;
}

Assistant:

Metric* Metrics::NewMetric(const string& name) {
  Metric* metric = new Metric;
  metric->name = name;
  metric->count = 0;
  metric->sum = 0;
  metrics_.push_back(metric);
  return metric;
}